

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonStartDocument(void *user_data)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  
  iVar1 = PyObject_HasAttrString(user_data,"startDocument");
  if (iVar1 != 0) {
    op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"startDocument",0);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
    return;
  }
  return;
}

Assistant:

static void
pythonStartDocument(void *user_data)
{
    PyObject *handler;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "startDocument")) {
        result =
            PyObject_CallMethod(handler, (char *) "startDocument", NULL);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}